

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O0

int gauden_invert_variance(gauden_t *g)

{
  uint local_20;
  uint local_1c;
  uint32 l;
  uint32 k;
  uint32 j;
  uint32 i;
  gauden_t *g_local;
  
  for (k = 0; k < g->n_mgau; k = k + 1) {
    for (l = 0; l < g->n_feat; l = l + 1) {
      for (local_1c = 0; local_1c < g->n_density; local_1c = local_1c + 1) {
        for (local_20 = 0; local_20 < g->veclen[l]; local_20 = local_20 + 1) {
          g->var[k][l][local_1c][local_20] = 1.0 / g->var[k][l][local_1c][local_20];
        }
      }
    }
  }
  return 0;
}

Assistant:

int
gauden_invert_variance(gauden_t *g)
{
    uint32 i, j, k, l;

    for (i = 0; i < g->n_mgau; i++) {
	for (j = 0; j < g->n_feat; j++) {
	    for (k = 0; k < g->n_density; k++) {
		for (l = 0; l < g->veclen[j]; l++) {
		    g->var[i][j][k][l] = 1.0 / g->var[i][j][k][l];
		}
	    }
	}
    }

    return S3_SUCCESS;
}